

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffComma(NodeDiffComputer *this,CommaExpr *lhs,CommaExpr *rhs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int32_t i;
  ulong uVar4;
  
  uVar1 = (lhs->_exprs)._size;
  iVar2 = uVar1 - (rhs->_exprs)._size;
  if (iVar2 == 0) {
    uVar4 = 0;
    iVar3 = 0;
    while ((iVar2 = iVar3, uVar4 < uVar1 &&
           (iVar2 = diffNodes(this,&(lhs->_exprs)._vals[uVar4]->super_Node,
                              &(rhs->_exprs)._vals[uVar4]->super_Node), iVar2 <= this->limit))) {
      iVar3 = iVar3 + iVar2;
      uVar4 = uVar4 + 1;
      uVar1 = (lhs->_exprs)._size;
    }
  }
  else {
    iVar3 = -iVar2;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    iVar2 = iVar3 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar2;
}

Assistant:

int32_t diffComma(const CommaExpr *lhs, const CommaExpr *rhs) {
    const auto &leftExpressions = lhs->expressions();
    const auto &rightExpression = rhs->expressions();

    if (leftExpressions.size() != rightExpression.size())
      return sizeDiff(leftExpressions.size(), rightExpression.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftExpressions.size(); ++i) {
      const Expr *l = leftExpressions[i];
      const Expr *r = rightExpression[i];

      int32_t tmp = diffNodes(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }